

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::LogRenderedText(ImVec2 *ref_pos,char *text,char *text_end)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  ImGuiContext *pIVar4;
  char *pcVar5;
  uint uVar6;
  char *line_start;
  char *__s;
  char *pcVar7;
  bool bVar8;
  
  pIVar4 = GImGui;
  if ((text_end == (char *)0x0) && (text_end = text, text != (char *)0xffffffffffffffff)) {
    do {
      if (*text_end == '#') {
        if (text_end[1] == '#') goto LAB_001208b7;
      }
      else if (*text_end == '\0') goto LAB_001208b7;
      text_end = text_end + 1;
    } while (text_end != (char *)0xffffffffffffffff);
    text_end = (char *)0xffffffffffffffff;
  }
LAB_001208b7:
  if (ref_pos == (ImVec2 *)0x0) {
    bVar3 = false;
  }
  else {
    bVar3 = GImGui->LogLinePosY + 1.0 < ref_pos->y;
    GImGui->LogLinePosY = ref_pos->y;
  }
  if (bVar3) {
    pIVar4->LogLineFirstItem = true;
  }
  iVar1 = (pIVar4->CurrentWindow->DC).TreeDepth;
  if (iVar1 < pIVar4->LogDepthRef) {
    pIVar4->LogDepthRef = iVar1;
  }
  iVar2 = pIVar4->LogDepthRef;
  __s = text;
  do {
    pcVar5 = (char *)memchr(__s,10,(long)text_end - (long)__s);
    pcVar7 = text_end;
    if (pcVar5 != (char *)0x0) {
      pcVar7 = pcVar5;
    }
    if (__s == pcVar7 && pcVar7 == text_end) {
      if (!bVar3) goto LAB_00120a2f;
      bVar8 = false;
      LogText("\n");
    }
    else {
      uVar6 = (int)pcVar7 - (int)__s;
      if ((bool)(~bVar3 & __s == text)) {
        if (pIVar4->LogLineFirstItem == true) {
          pcVar5 = "%*s%.*s";
          goto LAB_001209fe;
        }
        LogText(" %.*s",(ulong)uVar6,__s);
      }
      else {
        pcVar5 = "\n%*s%.*s";
LAB_001209fe:
        LogText(pcVar5,(ulong)(uint)((iVar1 - iVar2) * 4),"",(ulong)uVar6,__s);
      }
      pIVar4->LogLineFirstItem = false;
LAB_00120a2f:
      bVar8 = pcVar7 != text_end;
      if (bVar8) {
        __s = pcVar7 + 1;
      }
    }
    if (!bVar8) {
      return;
    }
  } while( true );
}

Assistant:

void ImGui::LogRenderedText(const ImVec2* ref_pos, const char* text, const char* text_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (!text_end)
        text_end = FindRenderedTextEnd(text, text_end);

    const bool log_new_line = ref_pos && (ref_pos->y > g.LogLinePosY + 1);
    if (ref_pos)
        g.LogLinePosY = ref_pos->y;
    if (log_new_line)
        g.LogLineFirstItem = true;

    const char* text_remaining = text;
    if (g.LogDepthRef > window->DC.TreeDepth)  // Re-adjust padding if we have popped out of our starting depth
        g.LogDepthRef = window->DC.TreeDepth;
    const int tree_depth = (window->DC.TreeDepth - g.LogDepthRef);
    for (;;)
    {
        // Split the string. Each new line (after a '\n') is followed by spacing corresponding to the current depth of our log entry.
        // We don't add a trailing \n to allow a subsequent item on the same line to be captured.
        const char* line_start = text_remaining;
        const char* line_end = ImStreolRange(line_start, text_end);
        const bool is_first_line = (line_start == text);
        const bool is_last_line = (line_end == text_end);
        if (!is_last_line || (line_start != line_end))
        {
            const int char_count = (int)(line_end - line_start);
            if (log_new_line || !is_first_line)
                LogText(IM_NEWLINE "%*s%.*s", tree_depth * 4, "", char_count, line_start);
            else if (g.LogLineFirstItem)
                LogText("%*s%.*s", tree_depth * 4, "", char_count, line_start);
            else
                LogText(" %.*s", char_count, line_start);
            g.LogLineFirstItem = false;
        }
        else if (log_new_line)
        {
            // An empty "" string at a different Y position should output a carriage return.
            LogText(IM_NEWLINE);
            break;
        }

        if (is_last_line)
            break;
        text_remaining = line_end + 1;
    }
}